

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O1

PropertyQueryFlags __thiscall
Js::CrossSiteObject<Js::SpreadArgument>::GetItemQuery
          (CrossSiteObject<Js::SpreadArgument> *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  CrossSite::MarshalVar
            ((((((this->super_SpreadArgument).super_DynamicObject.super_RecyclableObject.type.ptr)->
               javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
             originalInstance,false);
  SpreadArgument::AssertAndFailFast(&this->super_SpreadArgument);
  return Property_NotFound;
}

Assistant:

PropertyQueryFlags CrossSiteObject<T>::GetItemQuery(Var originalInstance, uint32 index, Var* value, ScriptContext * requestContext)
    {
        originalInstance = CrossSite::MarshalVar(this->GetScriptContext(), originalInstance);
        PropertyQueryFlags result = __super::GetItemQuery(originalInstance, index, value, requestContext);
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(result))
        {
            *value = CrossSite::MarshalVar(requestContext, *value);
        }
        return result;
    }